

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

void hexdump(char *p,char *ref,size_t l,size_t offset)

{
  uint uVar1;
  int in_ECX;
  ulong in_RDX;
  long in_RSI;
  long in_RDI;
  wchar_t c;
  char sep;
  size_t j;
  size_t i;
  char local_31;
  ulong local_30;
  ulong local_28;
  
  if (in_RDI == 0) {
    logprintf("(null)\n");
  }
  else {
    for (local_28 = 0; local_28 < in_RDX; local_28 = local_28 + 0x10) {
      logprintf("%04x",(ulong)(uint)((int)local_28 + in_ECX));
      local_31 = ' ';
      for (local_30 = 0; local_30 < 0x10 && local_28 + local_30 < in_RDX; local_30 = local_30 + 1) {
        if ((in_RSI != 0) &&
           (*(char *)(in_RDI + local_28 + local_30) != *(char *)(in_RSI + local_28 + local_30))) {
          local_31 = '_';
        }
        logprintf("%c%02x",(ulong)(uint)(int)local_31,(ulong)*(byte *)(in_RDI + local_28 + local_30)
                 );
        if ((in_RSI != 0) &&
           (*(char *)(in_RDI + local_28 + local_30) == *(char *)(in_RSI + local_28 + local_30))) {
          local_31 = ' ';
        }
      }
      for (; local_30 < 0x10; local_30 = local_30 + 1) {
        logprintf("%c  ",(ulong)(uint)(int)local_31);
        local_31 = ' ';
      }
      logprintf("%c",(ulong)(uint)(int)local_31);
      for (local_30 = 0; local_30 < 0x10 && local_28 + local_30 < in_RDX; local_30 = local_30 + 1) {
        uVar1 = (uint)*(char *)(in_RDI + local_28 + local_30);
        if (((int)uVar1 < 0x20) || (0x7e < (int)uVar1)) {
          logprintf(".");
        }
        else {
          logprintf("%c",(ulong)uVar1);
        }
      }
      logprintf("\n");
    }
  }
  return;
}

Assistant:

static void
hexdump(const char *p, const char *ref, size_t l, size_t offset)
{
	size_t i, j;
	char sep;

	if (p == NULL) {
		logprintf("(null)\n");
		return;
	}
	for(i=0; i < l; i+=16) {
		logprintf("%04x", (unsigned)(i + offset));
		sep = ' ';
		for (j = 0; j < 16 && i + j < l; j++) {
			if (ref != NULL && p[i + j] != ref[i + j])
				sep = '_';
			logprintf("%c%02x", sep, 0xff & (int)p[i+j]);
			if (ref != NULL && p[i + j] == ref[i + j])
				sep = ' ';
		}
		for (; j < 16; j++) {
			logprintf("%c  ", sep);
			sep = ' ';
		}
		logprintf("%c", sep);
		for (j=0; j < 16 && i + j < l; j++) {
			int c = p[i + j];
			if (c >= ' ' && c <= 126)
				logprintf("%c", c);
			else
				logprintf(".");
		}
		logprintf("\n");
	}
}